

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler
          (CombinedImageSamplerHandler *this,SPIRFunction *caller,VariableID combined_module_id,
          VariableID image_id,VariableID sampler_id,bool depth)

{
  Compiler *pCVar1;
  Compiler *pCVar2;
  bool bVar3;
  uint32_t uVar4;
  Parameter *pPVar5;
  Parameter *pPVar6;
  Parameter *pPVar7;
  CombinedImageSamplerParameter *pCVar8;
  CombinedImageSamplerParameter *pCVar9;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  bool local_1c1;
  bool local_1a1;
  Parameter local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118 [32];
  string local_f8;
  ID local_d8;
  TypedID<(spirv_cross::Types)2> local_d4;
  ID local_d0;
  ID local_cc;
  ID local_c8;
  ID local_c4;
  bool local_bd;
  undefined1 local_bc [7];
  bool relaxed_precision;
  TypedID<(spirv_cross::Types)1> local_b4;
  TypedID<(spirv_cross::Types)0> local_b0;
  undefined1 local_ac [12];
  SPIRType *ptr_type;
  SPIRType *local_98;
  SPIRType *type;
  SPIRType *base;
  uint32_t combined_id;
  uint32_t ptr_type_id;
  uint32_t type_id;
  uint32_t id;
  CombinedImageSamplerParameter *local_70;
  CombinedImageSamplerParameter *itr;
  TypedID<(spirv_cross::Types)2> local_60;
  VariableID local_5c;
  Parameter *local_58;
  Parameter *sampler_itr;
  Parameter *local_48;
  Parameter *texture_itr;
  uint32_t local_38;
  CombinedImageSamplerParameter param;
  bool depth_local;
  SPIRFunction *caller_local;
  CombinedImageSamplerHandler *this_local;
  TypedID<(spirv_cross::Types)2> local_10;
  VariableID sampler_id_local;
  VariableID image_id_local;
  VariableID combined_module_id_local;
  
  param.sampler_id.id._3_1_ = depth;
  unique0x100006fd = caller;
  this_local._4_4_ = sampler_id.id;
  local_10.id = image_id.id;
  sampler_id_local = combined_module_id;
  TypedID<(spirv_cross::Types)2>::TypedID
            ((TypedID<(spirv_cross::Types)2> *)((long)&texture_itr + 4),0);
  local_38 = local_10.id;
  param.id.id = this_local._4_4_;
  param.image_id.id._0_1_ = 1;
  param.image_id.id._1_1_ = 1;
  param.image_id.id._2_1_ = param.sampler_id.id._3_1_ & 1;
  pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  sampler_itr._4_4_ = local_10.id;
  local_48 = ::std::
             find_if<spirv_cross::SPIRFunction::Parameter*,spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::__0>
                       (pPVar5,pPVar6,(anon_class_4_1_b4afabfd_for__M_pred)local_10.id);
  pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  local_5c.id = this_local._4_4_;
  local_58 = ::std::
             find_if<spirv_cross::SPIRFunction::Parameter*,spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::__1>
                       (pPVar5,pPVar6,(anon_class_4_1_a60e1e70_for__M_pred)this_local._4_4_);
  pPVar5 = local_48;
  pPVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  pPVar6 = local_48;
  if (pPVar5 != pPVar7) {
    param.image_id.id._0_1_ = 0;
    pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                       (&stack0xffffffffffffffd8->arguments);
    TypedID<(spirv_cross::Types)2>::TypedID
              (&local_60,(uint32_t)(((long)pPVar6 - (long)pPVar5) / 0x14));
    local_38 = local_60.id;
  }
  pPVar5 = local_58;
  pPVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  pPVar6 = local_58;
  if (pPVar5 != pPVar7) {
    param.image_id.id._1_1_ = 0;
    pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                       (&stack0xffffffffffffffd8->arguments);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&itr + 4),
               (uint32_t)(((long)pPVar6 - (long)pPVar5) / 0x14));
    param.id.id = itr._4_4_;
  }
  if ((((byte)param.image_id.id & 1) == 0) || ((param.image_id.id._1_1_ & 1) == 0)) {
    pCVar8 = ::std::
             begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                       (&stack0xffffffffffffffd8->combined_parameters);
    pCVar9 = ::std::
             end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                       (&stack0xffffffffffffffd8->combined_parameters);
    _type_id = (CombinedImageSamplerParameter *)((long)&texture_itr + 4);
    pCVar8 = ::std::
             find_if<spirv_cross::SPIRFunction::CombinedImageSamplerParameter*,spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::__2>
                       (pCVar8,pCVar9,_type_id);
    local_70 = pCVar8;
    pCVar9 = ::std::
             end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                       (&stack0xffffffffffffffd8->combined_parameters);
    if (pCVar8 == pCVar9) {
      combined_id = ParsedIR::increase_bound_by(&this->compiler->ir,3);
      base._4_4_ = combined_id + 1;
      base._0_4_ = combined_id + 2;
      pCVar1 = this->compiler;
      ptr_type_id = combined_id;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
      type = expression_type(pCVar1,uVar4);
      ptr_type._4_4_ = 0x1b;
      local_98 = set<spirv_cross::SPIRType,spv::Op>
                           (this->compiler,combined_id,(Op *)((long)&ptr_type + 4));
      local_ac._0_4_ = OpTypePointer;
      local_ac._4_8_ = set<spirv_cross::SPIRType,spv::Op>(this->compiler,base._4_4_,(Op *)local_ac);
      SPIRType::operator=(local_98,type);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_b0,combined_id);
      (local_98->super_IVariant).self.id = local_b0.id;
      local_98->basetype = SampledImage;
      local_98->pointer = false;
      local_98->storage = Generic;
      (local_98->image).depth = (bool)(param.sampler_id.id._3_1_ & 1);
      SPIRType::operator=((SPIRType *)local_ac._4_8_,local_98);
      *(bool *)(local_ac._4_8_ + 0x7c) = true;
      *(StorageClass *)(local_ac._4_8_ + 0x80) = StorageClassUniformConstant;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_b4,combined_id);
      ((TypeID *)(local_ac._4_8_ + 0x114))->id = local_b4.id;
      stack0xffffffffffffff48 = 7;
      local_bc._0_4_ = 0;
      ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc;
      set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
                (this->compiler,(uint32_t)base,(uint *)((long)&base + 4),
                 (StorageClass *)(local_bc + 4),(int *)ts_2);
      pCVar1 = this->compiler;
      TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                (&local_c4,(TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4));
      bVar3 = has_decoration(pCVar1,local_c4,DecorationRelaxedPrecision);
      local_1a1 = true;
      if (!bVar3) {
        pCVar1 = this->compiler;
        TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>(&local_c8,&local_10);
        bVar3 = has_decoration(pCVar1,local_c8,DecorationRelaxedPrecision);
        local_1a1 = true;
        if (!bVar3) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&sampler_id_local);
          local_1c1 = false;
          if (uVar4 != 0) {
            pCVar1 = this->compiler;
            TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                      (&local_cc,&sampler_id_local);
            local_1c1 = has_decoration(pCVar1,local_cc,DecorationRelaxedPrecision);
          }
          local_1a1 = local_1c1;
        }
      }
      local_bd = local_1a1;
      if (local_1a1 != false) {
        pCVar1 = this->compiler;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_d0,(uint32_t)base);
        set_decoration(pCVar1,local_d0,DecorationRelaxedPrecision,0);
      }
      TypedID<(spirv_cross::Types)2>::TypedID(&local_d4,(uint32_t)base);
      texture_itr._4_4_ = local_d4.id;
      pCVar1 = this->compiler;
      TypedID<(spirv_cross::Types)0>::TypedID(&local_d8,(uint32_t)base);
      pCVar2 = this->compiler;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
      (*pCVar2->_vptr_Compiler[6])(local_118,pCVar2,(ulong)uVar4,1);
      pCVar2 = this->compiler;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      (*pCVar2->_vptr_Compiler[6])(&local_138,pCVar2,(ulong)uVar4,1);
      join<char_const(&)[21],std::__cxx11::string,std::__cxx11::string>
                (&local_f8,(spirv_cross *)"SPIRV_Cross_Combined",(char (*) [21])local_118,&local_138
                 ,ts_2);
      set_name(pCVar1,local_d8,&local_f8);
      ::std::__cxx11::string::~string((string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_138);
      ::std::__cxx11::string::~string(local_118);
      SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::push_back
                (&stack0xffffffffffffffd8->combined_parameters,
                 (CombinedImageSamplerParameter *)((long)&texture_itr + 4));
      this_00 = &stack0xffffffffffffffd8->shadow_arguments;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_158.type,base._4_4_);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_158.id,(uint32_t)base);
      local_158.read_count = 0;
      local_158.write_count = 0;
      local_158.alias_global_variable = true;
      SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back(this_00,&local_158);
    }
  }
  return;
}

Assistant:

void Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(SPIRFunction &caller,
                                                                            VariableID combined_module_id,
                                                                            VariableID image_id, VariableID sampler_id,
                                                                            bool depth)
{
	// We now have a texture ID and a sampler ID which will either be found as a global
	// or a parameter in our own function. If both are global, they will not need a parameter,
	// otherwise, add it to our list.
	SPIRFunction::CombinedImageSamplerParameter param = {
		0u, image_id, sampler_id, true, true, depth,
	};

	auto texture_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [image_id](const SPIRFunction::Parameter &p) { return p.id == image_id; });
	auto sampler_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [sampler_id](const SPIRFunction::Parameter &p) { return p.id == sampler_id; });

	if (texture_itr != end(caller.arguments))
	{
		param.global_image = false;
		param.image_id = uint32_t(texture_itr - begin(caller.arguments));
	}

	if (sampler_itr != end(caller.arguments))
	{
		param.global_sampler = false;
		param.sampler_id = uint32_t(sampler_itr - begin(caller.arguments));
	}

	if (param.global_image && param.global_sampler)
		return;

	auto itr = find_if(begin(caller.combined_parameters), end(caller.combined_parameters),
	                   [&param](const SPIRFunction::CombinedImageSamplerParameter &p) {
		                   return param.image_id == p.image_id && param.sampler_id == p.sampler_id &&
		                          param.global_image == p.global_image && param.global_sampler == p.global_sampler;
	                   });

	if (itr == end(caller.combined_parameters))
	{
		uint32_t id = compiler.ir.increase_bound_by(3);
		auto type_id = id + 0;
		auto ptr_type_id = id + 1;
		auto combined_id = id + 2;
		auto &base = compiler.expression_type(image_id);
		auto &type = compiler.set<SPIRType>(type_id, OpTypeSampledImage);
		auto &ptr_type = compiler.set<SPIRType>(ptr_type_id, OpTypePointer);

		type = base;
		type.self = type_id;
		type.basetype = SPIRType::SampledImage;
		type.pointer = false;
		type.storage = StorageClassGeneric;
		type.image.depth = depth;

		ptr_type = type;
		ptr_type.pointer = true;
		ptr_type.storage = StorageClassUniformConstant;
		ptr_type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, ptr_type_id, StorageClassFunction, 0);

		// Inherit RelaxedPrecision.
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    compiler.has_decoration(sampler_id, DecorationRelaxedPrecision) ||
		    compiler.has_decoration(image_id, DecorationRelaxedPrecision) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		param.id = combined_id;

		compiler.set_name(combined_id,
		                  join("SPIRV_Cross_Combined", compiler.to_name(image_id), compiler.to_name(sampler_id)));

		caller.combined_parameters.push_back(param);
		caller.shadow_arguments.push_back({ ptr_type_id, combined_id, 0u, 0u, true });
	}
}